

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::GetChannel
          (Error *__return_storage_ptr__,CommissionerApp *this,Channel *aChannel)

{
  ErrorCode EVar1;
  element_type *peVar2;
  int iVar3;
  Error *pEVar4;
  char *begin;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  parse_func local_50 [1];
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar3 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar3 == '\0') {
    local_78._0_4_ = none_type;
    local_70._M_p = "the commissioner is not active";
    local_68 = 0x1e;
    local_60._M_allocated_capacity = 0;
    local_50[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_60._8_8_ = (format_string_checker<char> *)local_78;
    while (begin = pcVar5, begin != "") {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_78);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_98,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_48._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)&sStack_98);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  else {
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x1a])(local_78,peVar2,&this->mActiveDataset,0xffff);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_78);
    EVar1 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_70);
    if (EVar1 == kNone) {
      if (((this->mActiveDataset).mPresentFlags & 0x4000) == 0) {
        abort();
      }
      *aChannel = (this->mActiveDataset).mChannel;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetChannel(Channel &aChannel)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    // Since channel will be updated by pending operational after a delay time,
    // we need to pull the active operational dataset.

    // TODO(wgtdkp): should we send MGMT_ACTIVE_GET.req for all GetXXX APIs ?
    SuccessOrExit(error = mCommissioner->GetActiveDataset(mActiveDataset, 0xFFFF));

    VerifyOrDie(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit);

    aChannel = mActiveDataset.mChannel;

exit:
    return error;
}